

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O2

void Sbc_ManDelayTrace(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Bit_t *p_00;
  Gia_Obj_t *pObj;
  int *piVar6;
  int Entry;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint local_50;
  uint local_4c;
  int *pLevels;
  uint local_3c;
  ulong local_38;
  
  p_00 = Vec_BitStart(p->nObjs);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    puts("No mapping is available.");
    return;
  }
  uVar2 = Gia_ManLutLevel(p,&pLevels);
  for (iVar8 = 0; iVar8 < p->vCos->nSize; iVar8 = iVar8 + 1) {
    pObj = Gia_ManCo(p,iVar8);
    iVar3 = Gia_ObjFaninId0p(p,pObj);
    if (pLevels[iVar3] == uVar2) {
      Vec_BitWriteEntry(p_00,iVar3,iVar3);
    }
  }
  iVar8 = p->nObjs;
  uVar9 = 0;
  local_50 = 0;
  local_4c = 0;
  local_3c = uVar2;
  do {
    do {
      uVar1 = (ulong)(iVar8 - 1);
      do {
        uVar7 = uVar1;
        if (iVar8 < 2) {
          iVar3 = 0;
          local_38 = uVar9;
          for (iVar8 = 1; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
            iVar4 = Gia_ObjIsLut(p,iVar8);
            if (iVar4 != 0) {
              for (lVar10 = 0; iVar4 = Gia_ObjLutSize(p,iVar8), lVar10 < iVar4; lVar10 = lVar10 + 1)
              {
                piVar6 = Gia_ObjLutFanins(p,iVar8);
                iVar4 = piVar6[lVar10];
                iVar5 = Vec_BitEntry(p_00,iVar8);
                if (iVar5 == 0) {
                  iVar4 = 0;
                }
                else {
                  iVar4 = Vec_BitEntry(p_00,iVar4);
                }
                iVar3 = iVar3 + iVar4;
              }
            }
          }
          if (pLevels != (int *)0x0) {
            free(pLevels);
            pLevels = (int *)0x0;
          }
          free(p_00->pArray);
          free(p_00);
          printf("AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n",
                 (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),local_38,
                 (ulong)local_3c,(ulong)local_50,(ulong)local_4c,iVar3);
          return;
        }
        iVar8 = iVar8 + -1;
        iVar3 = Gia_ObjIsLut(p,(int)uVar7);
        uVar1 = uVar7 - 1;
      } while (iVar3 == 0);
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar3 = Vec_BitEntry(p_00,iVar8);
    } while (iVar3 == 0);
    local_50 = local_50 + 1;
    for (lVar10 = 0; iVar3 = Gia_ObjLutSize(p,iVar8), lVar10 < iVar3; lVar10 = lVar10 + 1) {
      piVar6 = Gia_ObjLutFanins(p,iVar8);
      if (pLevels[uVar7] <= pLevels[piVar6[lVar10]] + 1) {
        if (pLevels[piVar6[lVar10]] + 1 != pLevels[uVar7]) {
          __assert_fail("pLevels[iFan] + 1 == pLevels[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                        ,0xaf,"void Sbc_ManDelayTrace(Gia_Man_t *)");
        }
        Vec_BitWriteEntry(p_00,piVar6[lVar10],Entry);
        local_4c = local_4c + 1;
      }
    }
  } while( true );
}

Assistant:

void Sbc_ManDelayTrace( Gia_Man_t * p )
{
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, iFan, nLevels, * pLevels;
    int nLuts = 0, nNodes = 0, nEdges = 0, nEdgesAll = 0;
    if ( !Gia_ManHasMapping(p) )
    {
        printf( "No mapping is available.\n" );
        return;
    }
    assert( Gia_ManHasMapping(p) );
    // set critical CO drivers
    nLevels = Gia_ManLutLevel( p, &pLevels );
    Gia_ManForEachCoDriverId( p, iFan, i )
        if ( pLevels[iFan] == nLevels )
            Vec_BitWriteEntry( vPath, iFan, 1 );
    // set critical internal nodes
    Gia_ManForEachLutReverse( p, i )
    { 
        nLuts++;
        if ( !Vec_BitEntry(vPath, i) )
            continue;
        nNodes++;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            if ( pLevels[iFan] +1 < pLevels[i] )
                continue;
            assert( pLevels[iFan] + 1 == pLevels[i] );
            Vec_BitWriteEntry( vPath, iFan, 1 );
            nEdges++;
            //printf( "%d -> %d\n", i, iFan );
        }
    }
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            nEdgesAll += (Vec_BitEntry(vPath, i) && Vec_BitEntry(vPath, iFan));

    ABC_FREE( pLevels );
    Vec_BitFree( vPath );
    printf( "AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n", 
        Gia_ManAndNum(p), nLuts, nLevels, nNodes, nEdges, nEdgesAll );
}